

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    uchar *in,size_t insize,LodePNGColorType colortype,uint bitdepth)

{
  uint uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  State *in_RDI;
  undefined4 in_stack_00000008;
  size_t buffersize;
  State state;
  uint error;
  uchar *buffer;
  undefined4 in_stack_fffffffffffffdcc;
  LodePNGColorMode *in_stack_fffffffffffffdd8;
  State *in_stack_fffffffffffffde0;
  uchar *in_stack_fffffffffffffe00;
  uchar *in_stack_fffffffffffffe08;
  const_iterator in_stack_fffffffffffffe18;
  LodePNGColorType in_stack_ffffffffffffff8c;
  size_t in_stack_ffffffffffffff90;
  uchar *in_stack_ffffffffffffff98;
  uint *in_stack_ffffffffffffffa0;
  uint *in_stack_ffffffffffffffa8;
  uchar **in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffc0;
  undefined8 local_38;
  
  uVar1 = lodepng_decode_memory
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                     in_stack_ffffffffffffffc0);
  if ((local_38 != 0) && (uVar1 == 0)) {
    State::State(in_stack_fffffffffffffde0);
    this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           lodepng_get_raw_size
                     ((uint)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                      (uint)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_00000008));
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_RDI,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_00000008));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              (this,in_stack_fffffffffffffe18,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    lodepng_free((void *)0x121daf);
    State::~State(in_RDI);
  }
  return uVar1;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h, const unsigned char* in,
		size_t insize, LodePNGColorType colortype, unsigned bitdepth)
	{
		unsigned char* buffer;
		unsigned error = lodepng_decode_memory(&buffer, &w, &h, in, insize, colortype, bitdepth);
		if (buffer && !error)
		{
			State state;
			state.info_raw.colortype = colortype;
			state.info_raw.bitdepth = bitdepth;
			size_t buffersize = lodepng_get_raw_size(w, h, &state.info_raw);
			out.insert(out.end(), &buffer[0], &buffer[buffersize]);
			lodepng_free(buffer);
		}
		return error;
	}